

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appendable.cpp
# Opt level: O1

UBool __thiscall icu_63::Appendable::appendString(Appendable *this,UChar *s,int32_t length)

{
  UChar UVar1;
  int iVar2;
  UChar *pUVar3;
  bool bVar4;
  
  if (length < 0) {
    do {
      UVar1 = *s;
      if (UVar1 == L'\0') {
        return '\x01';
      }
      s = s + 1;
      iVar2 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(ushort)UVar1);
    } while ((char)iVar2 != '\0');
    if (UVar1 != L'\0') {
      return '\0';
    }
  }
  else if (length != 0) {
    pUVar3 = s + 1;
    do {
      iVar2 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)(ushort)pUVar3[-1]);
      if ((char)iVar2 == '\0') break;
      bVar4 = pUVar3 < s + (uint)length;
      pUVar3 = pUVar3 + 1;
    } while (bVar4);
    if ((char)iVar2 == '\0') {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

UBool
Appendable::appendString(const UChar *s, int32_t length) {
    if(length<0) {
        UChar c;
        while((c=*s++)!=0) {
            if(!appendCodeUnit(c)) {
                return FALSE;
            }
        }
    } else if(length>0) {
        const UChar *limit=s+length;
        do {
            if(!appendCodeUnit(*s++)) {
                return FALSE;
            }
        } while(s<limit);
    }
    return TRUE;
}